

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::udp_socket::set_proxy_settings
          (udp_socket *this,proxy_settings *ps,alert_manager *alerts,resolver_interface *resolver,
          bool send_local_ep)

{
  socks5 *this_00;
  __shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (this->m_socks5_connection).
            super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (socks5 *)0x0) {
    socks5::close(this_00,(int)ps);
    ::std::__shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_socks5_connection).
                super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>);
  }
  proxy_settings::operator=(&this->m_proxy_settings,ps);
  if (((this->field_0xf0 & 1) == 0) && ((ps->type & ~socks4) == socks5)) {
    ::std::
    make_shared<libtorrent::aux::socks5,boost::asio::io_context&,libtorrent::aux::listen_socket_handle&,libtorrent::aux::alert_manager&,libtorrent::aux::resolver_interface&,bool_const&>
              ((io_context *)&local_40,(listen_socket_handle *)this->m_ioc,
               (alert_manager *)&this->m_listen_socket,(resolver_interface *)alerts,(bool *)resolver
              );
    ::std::__shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_socks5_connection).
                super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>,&local_40);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    socks5::start((this->m_socks5_connection).
                  super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ps)
    ;
  }
  return;
}

Assistant:

void udp_socket::set_proxy_settings(aux::proxy_settings const& ps
	, aux::alert_manager& alerts, aux::resolver_interface& resolver, bool const send_local_ep)
{
	TORRENT_ASSERT(is_single_thread());

	if (m_socks5_connection)
	{
		m_socks5_connection->close();
		m_socks5_connection.reset();
	}

	m_proxy_settings = ps;

	if (m_abort) return;

	if (ps.type == settings_pack::socks5
		|| ps.type == settings_pack::socks5_pw)
	{
		// connect to socks5 server and open up the UDP tunnel

		m_socks5_connection = std::make_shared<socks5>(m_ioc
			, m_listen_socket, alerts, resolver, send_local_ep);
		m_socks5_connection->start(ps);
	}
}